

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsViewPrivate::~QGraphicsViewPrivate(QGraphicsViewPrivate *this)

{
  QAbstractScrollAreaPrivate *in_RDI;
  
  *(undefined ***)&in_RDI->super_QFramePrivate = &PTR__QGraphicsViewPrivate_00d355f0;
  QRegion::~QRegion((QRegion *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x250);
  QRegion::~QRegion((QRegion *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.actions.d.size);
  QCursor::~QCursor((QCursor *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.redirectOffset);
  QRegion::~QRegion((QRegion *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.locale);
  QPixmap::~QPixmap((QPixmap *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.wrect);
  QBrush::~QBrush((QBrush *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.field_0x40);
  QBrush::~QBrush((QBrush *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.data.fnt);
  QList<QStyleOptionGraphicsItem>::~QList((QList<QStyleOptionGraphicsItem> *)0xa31888);
  QPointer<QGraphicsScene>::~QPointer((QPointer<QGraphicsScene> *)0xa31899);
  QEventStorage<QMouseEvent>::~QEventStorage((QEventStorage<QMouseEvent> *)in_RDI);
  QAbstractScrollAreaPrivate::~QAbstractScrollAreaPrivate(in_RDI);
  return;
}

Assistant:

QGraphicsViewPrivate::~QGraphicsViewPrivate()
{
}